

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O0

void memory_tree_ns::collect_labels_from_leaf
               (memory_tree *b,uint32_t cn,v_array<unsigned_int> *leaf_labs)

{
  example *peVar1;
  bool bVar2;
  node *pnVar3;
  ostream *this;
  v_array<unsigned_int> *pvVar4;
  uint *puVar5;
  example **ppeVar6;
  uint **ppuVar7;
  v_array<unsigned_int> *in_RDX;
  uint in_ESI;
  long in_RDI;
  uint32_t lab;
  uint *__end2;
  uint *__begin2;
  v_array<unsigned_int> *__range2;
  uint32_t loc;
  size_t i;
  uint *in_stack_ffffffffffffffa8;
  v_array<unsigned_int> *in_stack_ffffffffffffffb0;
  v_array<unsigned_int> *this_00;
  uint *local_38;
  v_array<unsigned_int> *local_20;
  
  pnVar3 = v_array<memory_tree_ns::node>::operator[]
                     ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)in_ESI);
  if (pnVar3->internal != -1) {
    this = std::operator<<((ostream *)&std::cout,"something is wrong, it should be a leaf node");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  v_array<unsigned_int>::clear(in_stack_ffffffffffffffb0);
  local_20 = (v_array<unsigned_int> *)0x0;
  while( true ) {
    this_00 = local_20;
    pnVar3 = v_array<memory_tree_ns::node>::operator[]
                       ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)in_ESI);
    pvVar4 = (v_array<unsigned_int> *)v_array<unsigned_int>::size(&pnVar3->examples_index);
    if (pvVar4 <= this_00) break;
    pnVar3 = v_array<memory_tree_ns::node>::operator[]
                       ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)in_ESI);
    puVar5 = v_array<unsigned_int>::operator[](&pnVar3->examples_index,(size_t)local_20);
    ppeVar6 = v_array<example_*>::operator[]((v_array<example_*> *)(in_RDI + 0x28),(ulong)*puVar5);
    peVar1 = *ppeVar6;
    ppuVar7 = v_array<unsigned_int>::begin((v_array<unsigned_int> *)&(peVar1->l).simple);
    local_38 = *ppuVar7;
    ppuVar7 = v_array<unsigned_int>::end((v_array<unsigned_int> *)&(peVar1->l).simple);
    puVar5 = *ppuVar7;
    for (; local_38 != puVar5; local_38 = local_38 + 1) {
      bVar2 = v_array_contains<unsigned_int>(in_RDX,*local_38);
      if (!bVar2) {
        v_array<unsigned_int>::push_back(this_00,in_stack_ffffffffffffffa8);
      }
    }
    local_20 = (v_array<unsigned_int> *)((long)&local_20->_begin + 1);
  }
  return;
}

Assistant:

void collect_labels_from_leaf(memory_tree& b, const uint32_t cn, v_array<uint32_t>& leaf_labs){
        if (b.nodes[cn].internal != -1)
            cout<<"something is wrong, it should be a leaf node"<<endl;
    
        leaf_labs.clear();
        for (size_t i = 0; i < b.nodes[cn].examples_index.size(); i++){ //scan through each memory in the leaf
            uint32_t loc = b.nodes[cn].examples_index[i];
            for (uint32_t lab: b.examples[loc]->l.multilabels.label_v){ //scan through each label:
                if (v_array_contains(leaf_labs, lab) == false)
                    leaf_labs.push_back(lab); 
            }
        }
    }